

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytevector.c
# Opt level: O3

sexp_conflict
utf16_2_str(sexp_conflict ctx,char *bv,int len,sexp_conflict endianness,int endianness_mandatory)

{
  long lVar1;
  uint len_00;
  long lVar2;
  sexp_conflict psVar3;
  long lVar4;
  uint c;
  ushort uVar5;
  ushort uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uchar *p;
  bool bVar10;
  
  bVar10 = (((ctx->value).type.setters)->value).type.slots != endianness;
  if (1 < len && endianness_mandatory == 0) {
    lVar8 = 2;
    if (*(short *)bv == -2) {
      bVar10 = true;
      goto LAB_001024bb;
    }
    if (*(short *)bv == -0x101) goto LAB_001024bb;
  }
  lVar8 = 0;
LAB_001024bb:
  lVar1 = (long)len + -1;
  lVar9 = (long)len + -3;
  lVar4 = 1;
  if (lVar8 < lVar1) {
    lVar2 = 0;
    lVar4 = lVar8;
    do {
      uVar5 = *(ushort *)(bv + lVar4);
      if (bVar10) {
        uVar6 = uVar5 << 8;
        uVar5 = uVar6 | uVar5 >> 8;
        if ((uVar6 & 0xfc00) == 0xd800 && lVar4 < lVar9) {
          uVar6 = *(ushort *)(bv + lVar4 + 2) << 8 | *(ushort *)(bv + lVar4 + 2) >> 8;
LAB_0010253b:
          if ((uVar6 & 0xfc00) == 0xdc00) {
            uVar5 = uVar5 * 0x400 + uVar6 + 0x2400;
            lVar4 = lVar4 + 2;
          }
        }
      }
      else if ((uVar5 & 0xfc00) == 0xd800 && lVar4 < lVar9) {
        uVar6 = *(ushort *)(bv + lVar4 + 2);
        goto LAB_0010253b;
      }
      lVar7 = 3 - (ulong)(uVar5 < 0x800);
      if (uVar5 < 0x80) {
        lVar7 = 1;
      }
      lVar2 = lVar2 + lVar7;
      lVar4 = lVar4 + 2;
    } while (lVar4 < lVar1);
    lVar4 = lVar2 * 2 + 1;
  }
  psVar3 = (sexp_conflict)sexp_make_string_op(ctx,0,2,lVar4,0x43e);
  if ((((ulong)psVar3 & 3) == 0 && psVar3 != (sexp_conflict)0x0) &&
     (psVar3->tag == 9 && lVar8 < lVar1)) {
    p = (uchar *)((((psVar3->value).type.cpl)->value).flonum_bits +
                 (long)(((psVar3->value).type.name)->value).flonum_bits);
    do {
      uVar5 = *(ushort *)(bv + lVar8);
      if (bVar10) {
        uVar6 = uVar5 << 8;
        uVar5 = uVar6 | uVar5 >> 8;
        if ((uVar6 & 0xfc00) == 0xd800 && lVar8 < lVar9) {
          uVar6 = *(ushort *)(bv + lVar8 + 2) << 8 | *(ushort *)(bv + lVar8 + 2) >> 8;
LAB_00102646:
          if ((uVar6 & 0xfc00) == 0xdc00) {
            uVar5 = uVar5 * 0x400 + uVar6 + 0x2400;
            lVar8 = lVar8 + 2;
          }
        }
      }
      else if ((uVar5 & 0xfc00) == 0xd800 && lVar8 < lVar9) {
        uVar6 = *(ushort *)(bv + lVar8 + 2);
        goto LAB_00102646;
      }
      c = (uint)uVar5;
      len_00 = 3 - (c < 0x800);
      if (c < 0x80) {
        len_00 = 1;
      }
      utf8_encode_char(p,len_00,c);
      p = p + len_00;
      lVar8 = lVar8 + 2;
    } while (lVar8 < lVar1);
  }
  return psVar3;
}

Assistant:

sexp utf16_2_str(sexp ctx, char* bv, int len, sexp endianness, int endianness_mandatory) {
  int swap = endianness != sexp_global(ctx, SEXP_G_ENDIANNESS);
  uint16_t ch, ch2;
  sexp_sint_t i, ch_len, utf8_len=0, start=0;
  sexp res;
  unsigned char* dst;
  if (!endianness_mandatory && len>1) {
    ch = *(uint16_t*)(bv);
    if (ch == 0xFFFE) {
      swap = 1;
      start = 2;
    } else if (ch == 0xFEFF) {
      start = 2;
    }
  }
  for (i=start; i+1<len; i+=2) {
    ch = swap ? sexp_swap_u16(*((uint16_t*)(bv+i))) : *((uint16_t*)(bv+i));
    if (0xd800 <= ch && ch <= 0xdbff && i+3<len) {
      ch2 = swap ? sexp_swap_u16(*((uint16_t*)(bv+i+2))) : *((uint16_t*)(bv+i+2));
      if (0xdc00 <= ch2 && ch2 <= 0xdfff) {
        ch = 0x10000 + (((ch - 0xd800) << 10) | (ch2 - 0xdc00));
        i += 2;
      }
    }
    utf8_len += utf8_char_byte_count(ch);
  }
  res = sexp_make_string(ctx, sexp_make_fixnum(utf8_len), SEXP_VOID);
  if (!(res && sexp_stringp(res))) return res;
  dst = (unsigned char*) sexp_string_data(res);
  for (i=start; i+1<len; i+=2) {
    ch = swap ? sexp_swap_u16(*((uint16_t*)(bv+i))) : *((uint16_t*)(bv+i));
    if (0xd800 <= ch && ch <= 0xdbff && i+3<len) {
      ch2 = swap ? sexp_swap_u16(*((uint16_t*)(bv+i+2))) : *((uint16_t*)(bv+i+2));
      if (0xdc00 <= ch2 && ch2 <= 0xdfff) {
        ch = 0x10000 + (((ch - 0xd800) << 10) | (ch2 - 0xdc00));
        i += 2;
      }
    }
    ch_len = utf8_char_byte_count(ch);
    utf8_encode_char(dst, ch_len, ch);
    dst += ch_len;
  }
  return res;
}